

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O1

int Cudd_ApaPrintMintermExp(FILE *fp,DdManager *dd,DdNode *node,int nvars,int precision)

{
  int iVar1;
  int iVar2;
  DdApaNumber number;
  int digits;
  int local_1c;
  
  number = Cudd_ApaCountMinterm(dd,node,nvars,&local_1c);
  if (number == (DdApaNumber)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = Cudd_ApaPrintExponential(fp,local_1c,number,precision);
    free(number);
    iVar2 = fprintf((FILE *)fp,"\n");
    if (iVar2 == -1) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
Cudd_ApaPrintMintermExp(
  FILE * fp,
  DdManager * dd,
  DdNode * node,
  int  nvars,
  int precision)
{
    int digits;
    int result;
    DdApaNumber count;

    count = Cudd_ApaCountMinterm(dd,node,nvars,&digits);
    if (count == NULL)
        return(0);
    result = Cudd_ApaPrintExponential(fp,digits,count,precision);
    ABC_FREE(count);
    if (fprintf(fp,"\n") == EOF) {
        return(0);
    }
    return(result);

}